

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::Net(Net *this)

{
  Option *pOVar1;
  Option *in_RDI;
  Option *in_stack_ffffffffffffffd0;
  NetPrivate *this_00;
  
  *(undefined ***)in_RDI = &PTR__Net_01fbfdb8;
  Option::Option(in_stack_ffffffffffffffd0);
  this_00 = (NetPrivate *)&in_RDI[1].blob_allocator;
  pOVar1 = (Option *)operator_new(0xc0);
  NetPrivate::NetPrivate(this_00,in_RDI);
  this_00->opt = pOVar1;
  return;
}

Assistant:

Net::Net()
    : d(new NetPrivate(opt))
{
}